

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

int __thiscall
lzham::lzcompressor::raw_parse_thread_state::init(raw_parse_thread_state *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long lVar2;
  node_state *pNodes;
  
  iVar1 = state::init(&this->m_state,ctx);
  if ((char)iVar1 != '\0') {
    if (ctx[0x3976] == (EVP_PKEY_CTX)0x1) {
      for (lVar2 = 0x548; lVar2 != 0x156710; lVar2 = lVar2 + 0x1c8) {
        *(undefined4 *)((long)(this->m_state).super_state_base.m_match_hist + lVar2 + -0x10) = 0;
      }
    }
    else {
      memset(this->m_nodes,0xff,0x2a038);
    }
  }
  return iVar1;
}

Assistant:

bool lzcompressor::raw_parse_thread_state::init(lzcompressor& lzcomp, const lzcompressor::init_params &params)
   {
      if (!m_state.init(lzcomp, params.m_table_max_update_interval, params.m_table_update_interval_slow_rate))
         return false;

      if (lzcomp.m_use_extreme_parsing)
      {
         for (uint j = 0; j < LZHAM_ARRAY_SIZE(m_nodes); j++)
            m_nodes[j].clear();
      }
      else
      {
         node_state *pNodes = reinterpret_cast<node_state*>(m_nodes);

         memset(pNodes, 0xFF, (1 + cMaxParseGraphNodes) * sizeof(node_state));
      }

      return true;
   }